

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

PluralRules * __thiscall icu_63::PluralRules::operator=(PluralRules *this,PluralRules *other)

{
  UBool UVar1;
  RuleChain *this_00;
  PluralRules *size;
  RuleChain *local_58;
  PluralRules *other_local;
  PluralRules *this_local;
  
  if (this != other) {
    size = other;
    if (this->mRules != (RuleChain *)0x0) {
      (*this->mRules->_vptr_RuleChain[1])();
    }
    this->mRules = (RuleChain *)0x0;
    this->mInternalStatus = other->mInternalStatus;
    UVar1 = ::U_FAILURE(this->mInternalStatus);
    if ((UVar1 == '\0') && (other->mRules != (RuleChain *)0x0)) {
      this_00 = (RuleChain *)UMemory::operator_new((UMemory *)0xe0,(size_t)size);
      local_58 = (RuleChain *)0x0;
      if (this_00 != (RuleChain *)0x0) {
        RuleChain::RuleChain(this_00,other->mRules);
        local_58 = this_00;
      }
      this->mRules = local_58;
      if (this->mRules == (RuleChain *)0x0) {
        this->mInternalStatus = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        UVar1 = ::U_FAILURE(this->mRules->fInternalStatus);
        if (UVar1 != '\0') {
          this->mInternalStatus = this->mRules->fInternalStatus;
        }
      }
    }
  }
  return this;
}

Assistant:

PluralRules&
PluralRules::operator=(const PluralRules& other) {
    if (this != &other) {
        delete mRules;
        mRules = nullptr;
        mInternalStatus = other.mInternalStatus;
        if (U_FAILURE(mInternalStatus)) {
            // bail out early if the object we were copying from was already 'invalid'.
            return *this;
        }
        if (other.mRules != nullptr) {
            mRules = new RuleChain(*other.mRules);
            if (mRules == nullptr) {
                mInternalStatus = U_MEMORY_ALLOCATION_ERROR;
            }
            else if (U_FAILURE(mRules->fInternalStatus)) {
                // If the RuleChain wasn't fully copied, then set our status to failure as well.
                mInternalStatus = mRules->fInternalStatus;
            }
        }
    }
    return *this;
}